

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_igsdb_shading_layer_json.unit.cpp
# Opt level: O2

void __thiscall
TestLoadIGSDBJSONFromDisk_TestLoadIGSDBPerforatedScreenShadingLayerJSON_Test::TestBody
          (TestLoadIGSDBJSONFromDisk_TestLoadIGSDBPerforatedScreenShadingLayerJSON_Test *this)

{
  variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>
  *__v;
  variant_alternative_t<0UL,_variant<vector<WLData,_allocator<WLData>_>,_DualBandBSDF>_> *pvVar1;
  MeasurementComponent *pMVar2;
  pointer *__ptr;
  _func_int **pp_Var3;
  char *pcVar4;
  AssertHelper local_9d8;
  AssertHelper local_9d0;
  AssertionResult gtest_ar_13;
  shared_ptr<OpticsParser::ProductData> material;
  ScopedTrace gtest_trace_60;
  shared_ptr<OpticsParser::PerforatedGeometry> geometry;
  Parser parser;
  path product_path;
  ProductData product;
  
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
             ,0x3c,"Begin Test: Load IGSDB perforated shading layer json format.");
  std::filesystem::__cxx11::path::path<char[96],std::filesystem::__cxx11::path>
            (&product_path,
             (char (*) [96])
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test"
             ,auto_format);
  std::filesystem::__cxx11::path::operator/=(&product_path,(char (*) [9])0x17f633);
  std::filesystem::__cxx11::path::operator/=
            (&product_path,(char (*) [25])"igsdb_v1_perforated.json");
  std::filesystem::__cxx11::path::string((string *)&geometry,&product_path);
  OpticsParser::Parser::parseJSONFile(&product,&parser,(string *)&geometry);
  std::__cxx11::string::~string((string *)&geometry);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[30]>
            ((internal *)&geometry,"product.name","\"Solar Comfort Radiant Barrier\"",&product.name,
             (char (*) [30])"Solar Comfort Radiant Barrier");
  if ((char)geometry.
            super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == '\0') {
    testing::Message::Message((Message *)&material);
    if (geometry.super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x188b0f;
    }
    else {
      pp_Var3 = (geometry.
                 super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x46,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&material);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if ((long *)CONCAT71(material.
                         super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._1_7_,
                         (char)material.
                               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(material.
                                     super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     (char)material.
                                           super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&geometry.
                    super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[8]>
            ((internal *)&geometry,"product.productType","\"shading\"",&product.productType,
             (char (*) [8])"shading");
  if ((char)geometry.
            super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == '\0') {
    testing::Message::Message((Message *)&material);
    if (geometry.super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x188b0f;
    }
    else {
      pp_Var3 = (geometry.
                 super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x47,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&material);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if ((long *)CONCAT71(material.
                         super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._1_7_,
                         (char)material.
                               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(material.
                                     super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     (char)material.
                                           super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&geometry.
                    super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[14]>
            ((internal *)&geometry,"product.manufacturer","\"Solar Comfort\"",&product.manufacturer,
             (char (*) [14])"Solar Comfort");
  if ((char)geometry.
            super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == '\0') {
    testing::Message::Message((Message *)&material);
    if (geometry.super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x188b0f;
    }
    else {
      pp_Var3 = (geometry.
                 super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x48,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&material);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if ((long *)CONCAT71(material.
                         super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._1_7_,
                         (char)material.
                               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(material.
                                     super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     (char)material.
                                           super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&geometry.
                    super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_1_ = 0;
  testing::internal::CmpHelperEQ<std::optional<double>,std::optional<double>>
            ((internal *)&geometry,"product.thickness","std::optional<double>()",&product.thickness,
             (optional<double> *)&material);
  if ((char)geometry.
            super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == '\0') {
    testing::Message::Message((Message *)&material);
    if (geometry.super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x188b0f;
    }
    else {
      pp_Var3 = (geometry.
                 super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x49,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&material);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if ((long *)CONCAT71(material.
                         super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._1_7_,
                         (char)material.
                               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(material.
                                     super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     (char)material.
                                           super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&geometry.
                    super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_1_ = 0;
  testing::internal::CmpHelperEQ<std::optional<double>,std::optional<double>>
            ((internal *)&geometry,"product.IRTransmittance","std::optional<double>()",
             &product.IRTransmittance,(optional<double> *)&material);
  if ((char)geometry.
            super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == '\0') {
    testing::Message::Message((Message *)&material);
    if (geometry.super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x188b0f;
    }
    else {
      pp_Var3 = (geometry.
                 super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4b,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&material);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if ((long *)CONCAT71(material.
                         super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._1_7_,
                         (char)material.
                               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(material.
                                     super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     (char)material.
                                           super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&geometry.
                    super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_1_ = 0;
  testing::internal::CmpHelperEQ<std::optional<double>,std::optional<double>>
            ((internal *)&geometry,"product.frontEmissivity","std::optional<double>()",
             &product.frontEmissivity,(optional<double> *)&material);
  if ((char)geometry.
            super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == '\0') {
    testing::Message::Message((Message *)&material);
    if (geometry.super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x188b0f;
    }
    else {
      pp_Var3 = (geometry.
                 super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4c,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&material);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if ((long *)CONCAT71(material.
                         super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._1_7_,
                         (char)material.
                               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(material.
                                     super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     (char)material.
                                           super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&geometry.
                    super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_1_ = 0;
  testing::internal::CmpHelperEQ<std::optional<double>,std::optional<double>>
            ((internal *)&geometry,"product.backEmissivity","std::optional<double>()",
             &product.backEmissivity,(optional<double> *)&material);
  if ((char)geometry.
            super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == '\0') {
    testing::Message::Message((Message *)&material);
    if (geometry.super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x188b0f;
    }
    else {
      pp_Var3 = (geometry.
                 super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4d,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&material);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if ((long *)CONCAT71(material.
                         super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._1_7_,
                         (char)material.
                               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(material.
                                     super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     (char)material.
                                           super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&geometry.
                    super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       product.measurements.
       super__Optional_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>,_true,_false,_false>
       .
       super__Optional_payload_base<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
       ._M_engaged;
  gtest_ar_13._0_8_ = gtest_ar_13._0_8_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&geometry,"product.measurements.has_value()","false",(bool *)&material,
             &gtest_ar_13.success_);
  if ((char)geometry.
            super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == '\0') {
    testing::Message::Message((Message *)&material);
    if (geometry.super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x188b0f;
    }
    else {
      pp_Var3 = (geometry.
                 super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x4e,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&material);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if ((long *)CONCAT71(material.
                         super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._1_7_,
                         (char)material.
                               super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(material.
                                     super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     (char)material.
                                           super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&geometry.
                    super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  std::dynamic_pointer_cast<OpticsParser::PerforatedGeometry,OpticsParser::ProductGeometry>
            ((shared_ptr<OpticsParser::ProductGeometry> *)&geometry);
  gtest_ar_13._0_8_ = &DAT_3ffb0a3d70a3d70a;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&material,"geometry->spacingX","1.69",
             (double *)
             (CONCAT71(geometry.
                       super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._1_7_,
                       (char)geometry.
                             super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 8),(double *)&gtest_ar_13);
  if ((char)material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_13);
    if ((undefined8 *)
        CONCAT71(material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._1_7_,
                 material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._0_1_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(material.
                                  super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._1_7_,
                                  material.
                                  super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x51,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d8,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper(&local_9d8);
    if (gtest_ar_13._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_13._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&material.
                    super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  gtest_ar_13._0_8_ = &DAT_3ffb0a3d70a3d70a;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&material,"geometry->spacingY","1.69",
             (double *)
             (CONCAT71(geometry.
                       super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._1_7_,
                       (char)geometry.
                             super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0x10),(double *)&gtest_ar_13);
  if ((char)material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_13);
    if ((undefined8 *)
        CONCAT71(material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._1_7_,
                 material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._0_1_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(material.
                                  super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._1_7_,
                                  material.
                                  super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x52,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d8,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper(&local_9d8);
    if (gtest_ar_13._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_13._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&material.
                    super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  gtest_ar_13._0_8_ = &DAT_3fe28f5c28f5c28f;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&material,"geometry->dimensionX","0.58",
             (double *)
             (CONCAT71(geometry.
                       super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._1_7_,
                       (char)geometry.
                             super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0x18),(double *)&gtest_ar_13);
  if ((char)material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_13);
    if ((undefined8 *)
        CONCAT71(material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._1_7_,
                 material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._0_1_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(material.
                                  super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._1_7_,
                                  material.
                                  super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x53,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d8,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper(&local_9d8);
    if (gtest_ar_13._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_13._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&material.
                    super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  gtest_ar_13._0_8_ = &DAT_4019666666666666;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&material,"geometry->dimensionY","6.35",
             (double *)
             (CONCAT71(geometry.
                       super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._1_7_,
                       (char)geometry.
                             super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0x20),(double *)&gtest_ar_13);
  if ((char)material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_13);
    if ((undefined8 *)
        CONCAT71(material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._1_7_,
                 material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._0_1_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(material.
                                  super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._1_7_,
                                  material.
                                  super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x54,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d8,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper(&local_9d8);
    if (gtest_ar_13._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_13._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&material.
                    super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&material,"geometry->perforationType","\"Circular\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT71(geometry.
                       super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._1_7_,
                       (char)geometry.
                             super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0x28),(char (*) [9])"Circular");
  if ((char)material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_13);
    if ((undefined8 *)
        CONCAT71(material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._1_7_,
                 material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._0_1_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT71(material.
                                  super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._1_7_,
                                  material.
                                  super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x55,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d8,(Message *)&gtest_ar_13);
    testing::internal::AssertHelper::~AssertHelper(&local_9d8);
    if (gtest_ar_13._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_13._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&material.
                    super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  std::__shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>,
             &product.materialDefinition.
              super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[21]>
            ((internal *)&gtest_ar_13,"material->name","\"SCRadiantBarrier.txt\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT71(material.
                       super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._1_7_,
                       (char)material.
                             super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0x18),(char (*) [21])"SCRadiantBarrier.txt");
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x57,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&gtest_ar_13,"material->productType","\"material\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT71(material.
                       super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._1_7_,
                       (char)material.
                             super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0x60),(char (*) [9])0x17f817);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x58,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[14]>
            ((internal *)&gtest_ar_13,"material->manufacturer","\"Solar Comfort\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT71(material.
                       super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._1_7_,
                       (char)material.
                             super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0x80),(char (*) [14])"Solar Comfort");
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x59,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  local_9d8.data_ = (AssertHelperData *)&DAT_3fcd70a3d70a3d71;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            ((internal *)&gtest_ar_13,"material->thickness","0.23",
             (optional<double> *)
             (CONCAT71(material.
                       super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._1_7_,
                       (char)material.
                             super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0xe0),(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  local_9d8.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            ((internal *)&gtest_ar_13,"material->IRTransmittance","0.0",
             (optional<double> *)
             (CONCAT71(material.
                       super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._1_7_,
                       (char)material.
                             super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0x100),(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  local_9d8.data_ = (AssertHelperData *)&DAT_3feb9db22d0e5604;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            ((internal *)&gtest_ar_13,"material->frontEmissivity","0.863",
             (optional<double> *)
             (CONCAT71(material.
                       super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._1_7_,
                       (char)material.
                             super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0x110),(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  local_9d8.data_ = (AssertHelperData *)&DAT_3feae147ae147ae1;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            ((internal *)&gtest_ar_13,"material->backEmissivity","0.84",
             (optional<double> *)
             (CONCAT71(material.
                       super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._1_7_,
                       (char)material.
                             super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0x120),(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  local_9d8.data_ = (AssertHelperData *)&DAT_3fbeb851eb851eb8;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            ((internal *)&gtest_ar_13,"material->conductivity","0.12",
             (optional<double> *)
             (CONCAT71(material.
                       super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._1_7_,
                       (char)material.
                             super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) + 0xf0),(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  local_9d8.data_._0_1_ =
       *(undefined1 *)
        (CONCAT71(material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr._1_7_,
                  (char)material.
                        super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr) + 0x5b0);
  local_9d0.data_._0_4_ = CONCAT31(local_9d0.data_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_13,"material->measurements.has_value()","true",(bool *)&local_9d8
             ,(bool *)&local_9d0);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x5f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  __v = std::
        optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
        ::value((optional<std::variant<std::vector<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>,_OpticsParser::DualBandBSDF>_>
                 *)(CONCAT71(material.
                             super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._1_7_,
                             (char)material.
                                   super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr) + 0x2e8));
  pvVar1 = std::
           get<0ul,std::vector<OpticsParser::WLData,std::allocator<OpticsParser::WLData>>,OpticsParser::DualBandBSDF>
                     (__v);
  local_9d8.data_ =
       (AssertHelperData *)
       (((long)(pvVar1->
               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>).
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(pvVar1->
              super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>).
              _M_impl.super__Vector_impl_data._M_start) / 0x70);
  local_9d0.data_._0_4_ = 0x1b9;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_13,"materialMeasurements.size()","441",
             (unsigned_long *)&local_9d8,(int *)&local_9d0);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x62,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  local_9d8.data_ = (AssertHelperData *)&DAT_3fd3333333333333;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_13,"materialMeasurements[0].wavelength","0.3",
             &((pvVar1->
               super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>).
               _M_impl.super__Vector_impl_data._M_start)->wavelength,(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,99,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  pMVar2 = std::optional<OpticsParser::MeasurementComponent>::value
                     (&((pvVar1->
                        super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                        )._M_impl.super__Vector_impl_data._M_start)->directComponent);
  local_9d8.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_13,"materialMeasurements[0].directComponent.value().tf","0.0",
             &pMVar2->tf,(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,100,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  pMVar2 = std::optional<OpticsParser::MeasurementComponent>::value
                     (&((pvVar1->
                        super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                        )._M_impl.super__Vector_impl_data._M_start)->directComponent);
  local_9d8.data_ = (AssertHelperData *)&DAT_3fb4538ef34d6a16;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_13,"materialMeasurements[0].directComponent.value().rf","0.0794",
             &pMVar2->rf,(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x65,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  pMVar2 = std::optional<OpticsParser::MeasurementComponent>::value
                     (&((pvVar1->
                        super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                        )._M_impl.super__Vector_impl_data._M_start)->directComponent);
  local_9d8.data_ = (AssertHelperData *)&DAT_3fb141205bc01a37;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_13,"materialMeasurements[0].directComponent.value().rb","0.0674",
             &pMVar2->rb,(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x66,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  local_9d8.data_ = (AssertHelperData *)&DAT_4004000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_13,"materialMeasurements[440].wavelength","2.50",
             &(pvVar1->
              super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>).
              _M_impl.super__Vector_impl_data._M_start[0x1b8].wavelength,(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x67,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  pMVar2 = std::optional<OpticsParser::MeasurementComponent>::value
                     (&(pvVar1->
                       super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                       )._M_impl.super__Vector_impl_data._M_start[0x1b8].directComponent);
  local_9d8.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_13,"materialMeasurements[440].directComponent.value().tf","0.0",
             &pMVar2->tf,(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x68,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  pMVar2 = std::optional<OpticsParser::MeasurementComponent>::value
                     (&(pvVar1->
                       super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                       )._M_impl.super__Vector_impl_data._M_start[0x1b8].directComponent);
  local_9d8.data_ = (AssertHelperData *)&DAT_3fe504816f0068dc;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_13,"materialMeasurements[440].directComponent.value().rf",
             "0.6568",&pMVar2->rf,(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x69,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  pMVar2 = std::optional<OpticsParser::MeasurementComponent>::value
                     (&(pvVar1->
                       super__Vector_base<OpticsParser::WLData,_std::allocator<OpticsParser::WLData>_>
                       )._M_impl.super__Vector_impl_data._M_start[0x1b8].directComponent);
  local_9d8.data_ = (AssertHelperData *)&DAT_3fdeb851eb851eb8;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_13,"materialMeasurements[440].directComponent.value().rb","0.48",
             &pMVar2->rb,(double *)&local_9d8);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&local_9d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_13.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_13.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_igsdb_shading_layer_json.unit.cpp"
               ,0x6a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9d0,(Message *)&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    if (local_9d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_9d8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_13.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&material.super___shared_ptr<OpticsParser::ProductData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&geometry.
              super___shared_ptr<OpticsParser::PerforatedGeometry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  OpticsParser::ProductData::~ProductData(&product);
  std::filesystem::__cxx11::path::~path(&product_path);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_60);
  return;
}

Assistant:

TEST(TestLoadIGSDBJSONFromDisk, TestLoadIGSDBPerforatedScreenShadingLayerJSON)
{
    SCOPED_TRACE("Begin Test: Load IGSDB perforated shading layer json format.");
    std::filesystem::path product_path(TEST_DATA_DIR);
    product_path /= "products";
    product_path /= "igsdb_v1_perforated.json";

    OpticsParser::Parser parser;

	auto product = parser.parseJSONFile(product_path.string());

    //    EXPECT_EQ(product.nfrcid.value(), 102);
    EXPECT_EQ(product.name, "Solar Comfort Radiant Barrier");
    EXPECT_EQ(product.productType, "shading");
    EXPECT_EQ(product.manufacturer, "Solar Comfort");
    EXPECT_EQ(product.thickness, std::optional<double>());
    // TODO EXPECT_EQ(product.conductivity, 1.0);
    EXPECT_EQ(product.IRTransmittance, std::optional<double>());
    EXPECT_EQ(product.frontEmissivity, std::optional<double>());
    EXPECT_EQ(product.backEmissivity, std::optional<double>());
    EXPECT_EQ(product.measurements.has_value(), false);
    auto geometry = std::dynamic_pointer_cast<OpticsParser::PerforatedGeometry>(
      product.geometry);
    EXPECT_EQ(geometry->spacingX, 1.69);
    EXPECT_EQ(geometry->spacingY, 1.69);
    EXPECT_EQ(geometry->dimensionX, 0.58);
    EXPECT_EQ(geometry->dimensionY, 6.35);
    EXPECT_EQ(geometry->perforationType, "Circular");
    auto material = product.materialDefinition;
    EXPECT_EQ(material->name, "SCRadiantBarrier.txt");
    EXPECT_EQ(material->productType, "material");
    EXPECT_EQ(material->manufacturer, "Solar Comfort");
    EXPECT_EQ(material->thickness, 0.23);
    EXPECT_EQ(material->IRTransmittance, 0.0);
    EXPECT_EQ(material->frontEmissivity, 0.863);
    EXPECT_EQ(material->backEmissivity, 0.84);
    EXPECT_EQ(material->conductivity, 0.12);
    EXPECT_EQ(material->measurements.has_value(), true);
    auto & materialMeasurements =
      std::get<std::vector<OpticsParser::WLData>>(material->measurements.value());
    EXPECT_EQ(materialMeasurements.size(), 441);
    EXPECT_EQ(materialMeasurements[0].wavelength, 0.3);
    EXPECT_EQ(materialMeasurements[0].directComponent.value().tf, 0.0);
    EXPECT_EQ(materialMeasurements[0].directComponent.value().rf, 0.0794);
    EXPECT_EQ(materialMeasurements[0].directComponent.value().rb, 0.0674);
    EXPECT_EQ(materialMeasurements[440].wavelength, 2.50);
    EXPECT_EQ(materialMeasurements[440].directComponent.value().tf, 0.0);
    EXPECT_EQ(materialMeasurements[440].directComponent.value().rf, 0.6568);
    EXPECT_EQ(materialMeasurements[440].directComponent.value().rb, 0.48);
}